

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

Elf64_Verdef * __thiscall
absl::debugging_internal::ElfMemImage::GetVerdef(ElfMemImage *this,int index)

{
  Elf64_Verdef *pEVar1;
  char *version_definition_as_char;
  Elf64_Verdef *pEVar2;
  
  if ((index < 0) || (this->verdefnum_ < (ulong)(uint)index)) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x83,"Check %s failed: %s",
               "0 <= index && static_cast<size_t>(index) <= verdefnum_","index out of range");
  }
  for (pEVar2 = this->verdef_; ((int)(uint)pEVar2->vd_ndx < index && ((ulong)pEVar2->vd_next != 0));
      pEVar2 = (Elf64_Verdef *)((long)&pEVar2->vd_version + (ulong)pEVar2->vd_next)) {
  }
  pEVar1 = (Elf64_Verdef *)0x0;
  if ((uint)pEVar2->vd_ndx == index) {
    pEVar1 = pEVar2;
  }
  return pEVar1;
}

Assistant:

const ElfW(Verdef) *ElfMemImage::GetVerdef(int index) const {
  ABSL_RAW_CHECK(0 <= index && static_cast<size_t>(index) <= verdefnum_,
                 "index out of range");
  const ElfW(Verdef) *version_definition = verdef_;
  while (version_definition->vd_ndx < index && version_definition->vd_next) {
    const char *const version_definition_as_char =
        reinterpret_cast<const char *>(version_definition);
    version_definition =
        reinterpret_cast<const ElfW(Verdef) *>(version_definition_as_char +
                                               version_definition->vd_next);
  }
  return version_definition->vd_ndx == index ? version_definition : nullptr;
}